

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_converter.cc
# Opt level: O0

void __thiscall
webrtc::AudioConverter::CheckSizes(AudioConverter *this,size_t src_size,size_t dst_capacity)

{
  size_t sVar1;
  size_t sVar2;
  FatalMessage local_340;
  unsigned_long local_1c8;
  string *local_1c0;
  string *_result_1;
  FatalMessage local_1a8;
  unsigned_long local_30;
  string *local_28;
  string *_result;
  size_t dst_capacity_local;
  size_t src_size_local;
  AudioConverter *this_local;
  
  _result = (string *)dst_capacity;
  dst_capacity_local = src_size;
  src_size_local = (size_t)this;
  sVar1 = src_channels(this);
  sVar2 = src_frames(this);
  local_30 = sVar1 * sVar2;
  local_28 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       (&dst_capacity_local,&local_30,"src_size == src_channels() * src_frames()");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_converter.cc"
               ,0xca,local_28);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  sVar1 = dst_channels(this);
  sVar2 = dst_frames(this);
  local_1c8 = sVar1 * sVar2;
  local_1c0 = rtc::CheckGEImpl<unsigned_long,unsigned_long>
                        ((unsigned_long *)&_result,&local_1c8,
                         "dst_capacity >= dst_channels() * dst_frames()");
  if (local_1c0 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_340,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/audio_converter.cc"
               ,0xcb,local_1c0);
    rtc::FatalMessage::stream(&local_340);
    rtc::FatalMessage::~FatalMessage(&local_340);
  }
  return;
}

Assistant:

void AudioConverter::CheckSizes(size_t src_size, size_t dst_capacity) const {
  RTC_CHECK_EQ(src_size, src_channels() * src_frames());
  RTC_CHECK_GE(dst_capacity, dst_channels() * dst_frames());
}